

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

Pdr_Set_t * Pdr_SetCreate(Vec_Int_t *vLits,Vec_Int_t *vPiLits)

{
  int iVar1;
  int iVar2;
  Pdr_Set_t *pPVar3;
  int local_24;
  int i;
  Pdr_Set_t *p;
  Vec_Int_t *vPiLits_local;
  Vec_Int_t *vLits_local;
  
  iVar1 = Vec_IntSize(vLits);
  iVar2 = Vec_IntSize(vPiLits);
  if (iVar1 + iVar2 < 0x40000000) {
    iVar1 = Vec_IntSize(vLits);
    iVar2 = Vec_IntSize(vPiLits);
    pPVar3 = (Pdr_Set_t *)malloc((long)(iVar1 + iVar2) * 4 + 0x18);
    iVar1 = Vec_IntSize(vLits);
    pPVar3->nLits = iVar1;
    iVar1 = Vec_IntSize(vLits);
    iVar2 = Vec_IntSize(vPiLits);
    pPVar3->nTotal = iVar1 + iVar2;
    pPVar3->nRefs = 1;
    pPVar3->Sign = 0;
    for (local_24 = 0; local_24 < pPVar3->nLits; local_24 = local_24 + 1) {
      iVar1 = Vec_IntEntry(vLits,local_24);
      *(int *)(&pPVar3->field_0x14 + (long)local_24 * 4) = iVar1;
      pPVar3->Sign = 1L << ((byte)((long)*(int *)(&pPVar3->field_0x14 + (long)local_24 * 4) % 0x3f)
                           & 0x3f) | pPVar3->Sign;
    }
    Vec_IntSelectSort((int *)&pPVar3->field_0x14,pPVar3->nLits);
    for (local_24 = pPVar3->nLits; local_24 < pPVar3->nTotal; local_24 = local_24 + 1) {
      iVar1 = Vec_IntEntry(vPiLits,local_24 - pPVar3->nLits);
      *(int *)(&pPVar3->field_0x14 + (long)local_24 * 4) = iVar1;
    }
    return pPVar3;
  }
  __assert_fail("Vec_IntSize(vLits) + Vec_IntSize(vPiLits) < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrUtil.c"
                ,0x45,"Pdr_Set_t *Pdr_SetCreate(Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Pdr_Set_t * Pdr_SetCreate( Vec_Int_t * vLits, Vec_Int_t * vPiLits )
{
    Pdr_Set_t * p;
    int i;
    assert( Vec_IntSize(vLits) + Vec_IntSize(vPiLits) < (1<<30) );
    p = (Pdr_Set_t *)ABC_ALLOC( char, sizeof(Pdr_Set_t) + (Vec_IntSize(vLits) + Vec_IntSize(vPiLits)) * sizeof(int) );
    p->nLits  = Vec_IntSize(vLits);
    p->nTotal = Vec_IntSize(vLits) + Vec_IntSize(vPiLits);
    p->nRefs  = 1;
    p->Sign   = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        p->Lits[i] = Vec_IntEntry(vLits, i);
        p->Sign   |= ((word)1 << (p->Lits[i] % 63));
    }
    Vec_IntSelectSort( p->Lits, p->nLits );
    // remember PI literals 
    for ( i = p->nLits; i < p->nTotal; i++ )
        p->Lits[i] = Vec_IntEntry(vPiLits, i-p->nLits);
    return p;
}